

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BranchLayerParams::~BranchLayerParams(BranchLayerParams *this)

{
  BranchLayerParams *this_local;
  
  ~BranchLayerParams(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

BranchLayerParams::~BranchLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BranchLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}